

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O0

int scv_replace(scv_vector *v,size_t i,size_t j,void *data,size_t nobj)

{
  undefined1 auVar1 [16];
  int res;
  size_t nobj_local;
  void *data_local;
  size_t j_local;
  size_t i_local;
  scv_vector *v_local;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x14d,
                  "int scv_replace(struct scv_vector *, size_t, size_t, const void *, size_t)");
  }
  if (v->data != (void *)0x0) {
    if ((j < i) || (v->size < j)) {
      v_local._4_4_ = -3;
    }
    else {
      if (v->objsize == 0) {
        __assert_fail("v->objsize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x154,
                      "int scv_replace(struct scv_vector *, size_t, size_t, const void *, size_t)");
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = v->objsize;
      if (nobj < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) -
                 (v->size - (j - i))) {
        if (((v->size - (j - i)) + nobj <= v->capacity) ||
           (v_local._4_4_ = scv_i_grow(v,(v->size - (j - i)) + nobj), v_local._4_4_ == 0)) {
          if ((j < v->size) && (i + nobj != j)) {
            memmove((void *)((long)v->data + (i + nobj) * v->objsize),
                    (void *)((long)v->data + j * v->objsize),(v->size - j) * v->objsize);
          }
          if ((data != (void *)0x0) && (nobj != 0)) {
            memcpy((void *)((long)v->data + i * v->objsize),data,nobj * v->objsize);
          }
          v->size = (v->size - (j - i)) + nobj;
          v_local._4_4_ = 0;
        }
      }
      else {
        v_local._4_4_ = -3;
      }
    }
    return v_local._4_4_;
  }
  __assert_fail("v->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x14e,
                "int scv_replace(struct scv_vector *, size_t, size_t, const void *, size_t)");
}

Assistant:

int scv_replace(struct scv_vector *v, size_t i, size_t j, const void *data, size_t nobj)
{
	assert(v != NULL);
	assert(v->data != NULL);

	if (i > j || j > v->size) {
		return SCV_ERANGE;
	}

	assert(v->objsize > 0);

	if (nobj >= (size_t) -1 / v->objsize - (v->size - (j - i))) {
		return SCV_ERANGE;
	}

	if (v->size - (j - i) + nobj > v->capacity) {
		int res = scv_i_grow(v, v->size - (j - i) + nobj);

		if (res != SCV_OK) {
			return res;
		}
	}

	if (j < v->size && i + nobj != j) {
		memmove(SCV_AT(v, i + nobj), SCV_AT(v, j), (v->size - j) * v->objsize);
	}

	if (data != NULL && nobj > 0) {
		memcpy(SCV_AT(v, i), data, nobj * v->objsize);
	}

	v->size = v->size - (j - i) + nobj;

	return SCV_OK;
}